

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMini.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFromMiniAig(Mini_Aig_t *p)

{
  Abc_Aig_t *pMan;
  uint uVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Ntk_t *pAVar7;
  int iVar8;
  Abc_Ntk_t *pTemp;
  int iVar9;
  
  iVar9 = p->nSize / 2;
  iVar8 = 1;
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar3 = (char *)malloc(8);
  builtin_strncpy(pcVar3,"MiniAig",8);
  pNtk->pName = pcVar3;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar2 = iVar9;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar2;
  if (iVar2 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar2 << 2);
  }
  p_00->pArray = piVar4;
  pAVar5 = Abc_AigConst1(pNtk);
  uVar1 = Abc_ObjToLit(pAVar5);
  Vec_IntPush(p_00,uVar1 ^ 1);
  do {
    if (iVar9 <= iVar8) {
      if (p_00->nSize == iVar9) {
        Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
        free(p_00->pArray);
        free(p_00);
        Abc_NtkAddDummyPiNames(pNtk);
        Abc_NtkAddDummyPoNames(pNtk);
        iVar8 = Abc_NtkCheck(pNtk);
        if (iVar8 == 0) {
          fwrite("Abc_NtkFromMini(): Network check has failed.\n",0x2d,1,_stdout);
        }
        if (0 < p->nRegs) {
          pAVar7 = Abc_NtkRestrashWithLatches(pNtk,p->nRegs);
          Abc_NtkDelete(pNtk);
          pNtk = pAVar7;
        }
        return pNtk;
      }
      pcVar3 = "Vec_IntSize(vCopies) == nNodes";
      uVar1 = 0x56;
LAB_0025a322:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMini.c"
                    ,uVar1,"Abc_Ntk_t *Abc_NtkFromMiniAig(Mini_Aig_t *)");
    }
    iVar2 = Mini_AigNodeIsPi(p,iVar8);
    if (iVar2 == 0) {
      iVar2 = Mini_AigNodeIsPo(p,iVar8);
      if (iVar2 == 0) {
        iVar2 = Mini_AigNodeIsAnd(p,iVar8);
        if (iVar2 == 0) {
          pcVar3 = "0";
          uVar1 = 0x53;
          goto LAB_0025a322;
        }
        pMan = (Abc_Aig_t *)pNtk->pManFunc;
        pAVar5 = Abc_NodeFanin0Copy(pNtk,p_00,p,iVar8);
        pAVar6 = Abc_NodeFanin1Copy(pNtk,p_00,p,iVar8);
        pAVar5 = Abc_AigAnd(pMan,pAVar5,pAVar6);
      }
      else {
        pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
        pAVar6 = Abc_NodeFanin0Copy(pNtk,p_00,p,iVar8);
        Abc_ObjAddFanin(pAVar5,pAVar6);
      }
    }
    else {
      pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
    }
    iVar2 = Abc_ObjToLit(pAVar5);
    Vec_IntPush(p_00,iVar2);
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkFromMiniAig( Mini_Aig_t * p )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj;
    Vec_Int_t * vCopies;
    int i, nNodes;
    // get the number of nodes
    nNodes = Mini_AigNodeNum(p);
    // create ABC network
    pNtk = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtk->pName = Abc_UtilStrsav( "MiniAig" );
    // create mapping from MiniAIG objects into ABC objects
    vCopies = Vec_IntAlloc( nNodes );
    Vec_IntPush( vCopies, Abc_LitNot(Abc_ObjToLit(Abc_AigConst1(pNtk))) );
    // iterate through the objects
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
            pObj = Abc_NtkCreatePi(pNtk);
        else if ( Mini_AigNodeIsPo( p, i ) )
            Abc_ObjAddFanin( (pObj = Abc_NtkCreatePo(pNtk)), Abc_NodeFanin0Copy(pNtk, vCopies, p, i) );
        else if ( Mini_AigNodeIsAnd( p, i ) )
            pObj = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc, Abc_NodeFanin0Copy(pNtk, vCopies, p, i), Abc_NodeFanin1Copy(pNtk, vCopies, p, i));
        else assert( 0 );
        Vec_IntPush( vCopies, Abc_ObjToLit(pObj) );
    }
    assert( Vec_IntSize(vCopies) == nNodes );
    Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
    Vec_IntFree( vCopies );
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkFromMini(): Network check has failed.\n" );
    // add latches
    if ( Mini_AigRegNum(p) > 0 )
    {
        extern Abc_Ntk_t * Abc_NtkRestrashWithLatches( Abc_Ntk_t * pNtk, int nLatches );
        Abc_Ntk_t * pTemp;
        pNtk = Abc_NtkRestrashWithLatches( pTemp = pNtk, Mini_AigRegNum(p) );
        Abc_NtkDelete( pTemp );
    }
    return pNtk;
}